

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::DumbDirectoryDatabase::write_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  FILE *__s;
  bool bVar5;
  string path;
  char filename [25];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  char local_58 [40];
  
  if ((flags & 1) != 0) {
    return false;
  }
  if (this->mode == ReadOnly) {
    return false;
  }
  iVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this);
  if ((char)iVar2 != '\0') {
    return true;
  }
  sprintf(local_58,"%02x.%016lx.json",(ulong)tag,hash);
  local_78._M_allocated_capacity = (size_type)&local_68;
  sVar4 = strlen(local_58);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_58,local_58 + sVar4);
  Path::join((string *)local_98,&this->base_directory,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  __s = fopen((char *)local_98._0_8_,"wb");
  if (__s == (FILE *)0x0) {
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar5 = false;
      bVar1 = Internal::log_thread_callback
                        (LOG_ERROR,"Failed to write serialized state to disk (%s).\n",local_98._0_8_
                        );
      if (bVar1) goto LAB_001495e3;
      write_entry((DumbDirectoryDatabase *)local_98);
    }
  }
  else {
    sVar4 = fwrite(blob,1,size,__s);
    if (sVar4 == size) {
      fclose(__s);
      bVar5 = true;
      goto LAB_001495e3;
    }
    LVar3 = get_thread_log_level();
    if (((int)LVar3 < 3) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_ERROR,"Failed to write serialized state to disk.\n"), !bVar1)) {
      write_entry();
    }
    fclose(__s);
  }
  bVar5 = false;
LAB_001495e3:
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  return bVar5;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode == DatabaseMode::ReadOnly)
			return false;

		if (has_entry(tag, hash))
			return true;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "wb");
		if (!file)
		{
			LOGE_LEVEL("Failed to write serialized state to disk (%s).\n", path.c_str());
			return false;
		}

		if (fwrite(blob, 1, size, file) != size)
		{
			LOGE_LEVEL("Failed to write serialized state to disk.\n");
			fclose(file);
			return false;
		}

		fclose(file);
		return true;
	}